

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O0

int32 gauden_mean_reload(gauden_t *g,char *meanfile)

{
  int32 *local_30;
  int32 *flen;
  int32 d;
  int32 f;
  int32 m;
  int32 i;
  char *meanfile_local;
  gauden_t *g_local;
  
  _m = meanfile;
  meanfile_local = (char *)g;
  if (g->mean == (vector_t ***)0x0) {
    __assert_fail("g->mean != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                  ,0x1c3,"int32 gauden_mean_reload(gauden_t *, const char *)");
  }
  gauden_param_read(&g->mean,&d,(int32 *)((long)&flen + 4),(int32 *)&flen,&local_30,meanfile);
  if (((d == *(int *)(meanfile_local + 0x20)) && (flen._4_4_ == *(int *)(meanfile_local + 0x24))) &&
     ((int)flen == *(int *)(meanfile_local + 0x28))) {
    f = 0;
    while( true ) {
      if (*(int *)(meanfile_local + 0x24) <= f) {
        ckd_free(local_30);
        return 0;
      }
      if (*(int *)(*(long *)(meanfile_local + 0x30) + (long)f * 4) != local_30[f]) break;
      f = f + 1;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
            ,0x1cd,"Feature lengths for original and new means differ\n");
    exit(1);
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
          ,0x1ca,"Mixture-gaussians dimensions for original and new means differ\n");
  exit(1);
}

Assistant:

int32
gauden_mean_reload(gauden_t * g, const char *meanfile)
{
    int32 i, m, f, d, *flen;

    assert(g->mean != NULL);

    gauden_param_read(&(g->mean), &m, &f, &d, &flen, meanfile);

    /* Verify original and new mean parameter dimensions */
    if ((m != g->n_mgau) || (f != g->n_feat) || (d != g->n_density))
        E_FATAL
            ("Mixture-gaussians dimensions for original and new means differ\n");
    for (i = 0; i < g->n_feat; i++)
        if (g->featlen[i] != flen[i])
            E_FATAL("Feature lengths for original and new means differ\n");
    ckd_free(flen);

    return 0;
}